

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse.h
# Opt level: O0

void FSE_initCState2(FSE_CState_t *statePtr,FSE_CTable *ct,U32 symbol)

{
  undefined8 uVar1;
  uint uVar2;
  uint in_EDX;
  FSE_CState_t *in_RSI;
  ulong *in_RDI;
  U32 nbBitsOut;
  U16 *stateTable;
  FSE_symbolCompressionTransform symbolTT;
  int local_1c;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar3;
  
  FSE_initCState(in_RSI,(FSE_CTable *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  uVar1 = *(undefined8 *)(in_RDI[2] + (ulong)in_EDX * 8);
  local_1c = (int)uVar1;
  iVar3 = (int)((ulong)uVar1 >> 0x20);
  uVar2 = iVar3 + 0x8000;
  *in_RDI = (ulong)((uVar2 & 0xffff0000) - iVar3);
  *in_RDI = (ulong)*(ushort *)
                    (in_RDI[1] +
                    (((long)*in_RDI >> ((byte)(uVar2 >> 0x10) & 0x3f)) + (long)local_1c) * 2);
  return;
}

Assistant:

MEM_STATIC void FSE_initCState2(FSE_CState_t* statePtr, const FSE_CTable* ct, U32 symbol)
{
    FSE_initCState(statePtr, ct);
    {   const FSE_symbolCompressionTransform symbolTT = ((const FSE_symbolCompressionTransform*)(statePtr->symbolTT))[symbol];
        const U16* stateTable = (const U16*)(statePtr->stateTable);
        U32 nbBitsOut  = (U32)((symbolTT.deltaNbBits + (1<<15)) >> 16);
        statePtr->value = (nbBitsOut << 16) - symbolTT.deltaNbBits;
        statePtr->value = stateTable[(statePtr->value >> nbBitsOut) + symbolTT.deltaFindState];
    }
}